

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_writeout.c
# Opt level: O0

void ourWriteOut(char *writeinfo,per_transfer *per,CURLcode per_result)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  int local_48;
  _Bool match;
  int i;
  char keepit;
  char *end;
  char *pcStack_30;
  _Bool done;
  char *ptr;
  FILE *stream;
  CURLcode per_result_local;
  per_transfer *per_local;
  char *writeinfo_local;
  
  ptr = _stdout;
  bVar3 = 0;
  pcStack_30 = writeinfo;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            bVar2 = false;
            if ((pcStack_30 != (char *)0x0) && (bVar2 = false, *pcStack_30 != '\0')) {
              bVar2 = (bool)(bVar3 ^ 1);
            }
            if (!bVar2) {
              return;
            }
            if ((*pcStack_30 == '%') && (pcStack_30[1] != '\0')) break;
            if ((*pcStack_30 == '\\') && (pcStack_30[1] != '\0')) {
              cVar1 = pcStack_30[1];
              if (cVar1 == 'n') {
                fputc(10,(FILE *)ptr);
              }
              else if (cVar1 == 'r') {
                fputc(0xd,(FILE *)ptr);
              }
              else if (cVar1 == 't') {
                fputc(9,(FILE *)ptr);
              }
              else {
                fputc((int)*pcStack_30,(FILE *)ptr);
                fputc((int)pcStack_30[1],(FILE *)ptr);
              }
              pcStack_30 = pcStack_30 + 2;
            }
            else {
              fputc((int)*pcStack_30,(FILE *)ptr);
              pcStack_30 = pcStack_30 + 1;
            }
          }
          if (pcStack_30[1] != '%') break;
          fputc(0x25,(FILE *)ptr);
          pcStack_30 = pcStack_30 + 2;
        }
        if (pcStack_30[1] == '{') break;
        fputc(0x25,(FILE *)ptr);
        fputc((int)pcStack_30[1],(FILE *)ptr);
        pcStack_30 = pcStack_30 + 2;
      }
      bVar2 = false;
      pcVar5 = strchr(pcStack_30,0x7d);
      pcStack_30 = pcStack_30 + 2;
      if (pcVar5 != (char *)0x0) break;
      fputs("%{",(FILE *)ptr);
    }
    cVar1 = *pcVar5;
    *pcVar5 = '\0';
    local_48 = 0;
    while (variables[local_48].name != (char *)0x0) {
      iVar4 = curl_strequal(pcStack_30,variables[local_48].name);
      if (iVar4 != 0) {
        bVar2 = true;
        switch(variables[local_48].id) {
        case VAR_JSON:
          ourWriteOutJSON((FILE *)ptr,variables,per,per_result);
          break;
        default:
          (*variables[local_48].writefunc)((FILE *)ptr,variables + local_48,per,per_result,false);
          break;
        case VAR_ONERROR:
          if (per_result == CURLE_OK) {
            bVar3 = 1;
          }
          break;
        case VAR_STDERR:
          ptr = _stderr;
          break;
        case VAR_STDOUT:
          ptr = _stdout;
        }
        break;
      }
      local_48 = local_48 + 1;
    }
    if (!bVar2) {
      curl_mfprintf(_stderr,"curl: unknown --write-out variable: \'%s\'\n",pcStack_30);
    }
    pcStack_30 = pcVar5 + 1;
    *pcVar5 = cVar1;
  } while( true );
}

Assistant:

void ourWriteOut(const char *writeinfo, struct per_transfer *per,
                 CURLcode per_result)
{
  FILE *stream = stdout;
  const char *ptr = writeinfo;
  bool done = FALSE;

  while(ptr && *ptr && !done) {
    if('%' == *ptr && ptr[1]) {
      if('%' == ptr[1]) {
        /* an escaped %-letter */
        fputc('%', stream);
        ptr += 2;
      }
      else {
        /* this is meant as a variable to output */
        char *end;
        if('{' == ptr[1]) {
          char keepit;
          int i;
          bool match = FALSE;
          end = strchr(ptr, '}');
          ptr += 2; /* pass the % and the { */
          if(!end) {
            fputs("%{", stream);
            continue;
          }
          keepit = *end;
          *end = 0; /* null-terminate */
          for(i = 0; variables[i].name; i++) {
            if(curl_strequal(ptr, variables[i].name)) {
              match = TRUE;
              switch(variables[i].id) {
              case VAR_ONERROR:
                if(per_result == CURLE_OK)
                  /* this isn't error so skip the rest */
                  done = TRUE;
                break;
              case VAR_STDOUT:
                stream = stdout;
                break;
              case VAR_STDERR:
                stream = stderr;
                break;
              case VAR_JSON:
                ourWriteOutJSON(stream, variables, per, per_result);
                break;
              default:
                (void)variables[i].writefunc(stream, &variables[i],
                                             per, per_result, false);
                break;
              }
              break;
            }
          }
          if(!match) {
            fprintf(stderr, "curl: unknown --write-out variable: '%s'\n", ptr);
          }
          ptr = end + 1; /* pass the end */
          *end = keepit;
        }
        else {
          /* illegal syntax, then just output the characters that are used */
          fputc('%', stream);
          fputc(ptr[1], stream);
          ptr += 2;
        }
      }
    }
    else if('\\' == *ptr && ptr[1]) {
      switch(ptr[1]) {
      case 'r':
        fputc('\r', stream);
        break;
      case 'n':
        fputc('\n', stream);
        break;
      case 't':
        fputc('\t', stream);
        break;
      default:
        /* unknown, just output this */
        fputc(*ptr, stream);
        fputc(ptr[1], stream);
        break;
      }
      ptr += 2;
    }
    else {
      fputc(*ptr, stream);
      ptr++;
    }
  }
}